

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_diag_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_trace_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int64_t iVar1;
  int *piVar2;
  int *piVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined8 uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  undefined1 (*ptr) [16];
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  int64_t iVar35;
  ulong uVar36;
  int64_t iVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  uint uVar51;
  ulong uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar83 [32];
  undefined1 auVar82 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  long lVar88;
  long lVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  long local_3d8;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  ulong local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  long local_280;
  long lStack_278;
  long lStack_270;
  long lStack_268;
  long local_260;
  long lStack_258;
  long lStack_250;
  long lStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  long local_1c0;
  long lStack_1b8;
  long lStack_1b0;
  long lStack_1a8;
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  ulong local_a0;
  ulong uStack_98;
  ulong uStack_90;
  ulong uStack_88;
  undefined1 local_80 [32];
  
  if (_s2 == (char *)0x0) {
    parasail_sw_trace_diag_avx2_256_64_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_trace_diag_avx2_256_64_cold_6();
  }
  else if (open < 0) {
    parasail_sw_trace_diag_avx2_256_64_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_trace_diag_avx2_256_64_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_trace_diag_avx2_256_64_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_trace_diag_avx2_256_64_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar31 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_sw_trace_diag_avx2_256_64_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar31 = (ulong)(uint)matrix->length;
    }
    local_240._0_8_ = _s1;
    local_200._0_8_ = _s2;
    iVar18 = matrix->min;
    uVar46 = 0x8000000000000000 - (long)iVar18;
    if (iVar18 != -open && SBORROW4(iVar18,-open) == iVar18 + open < 0) {
      uVar46 = (ulong)(uint)open | 0x8000000000000000;
    }
    lVar30 = uVar46 + 1;
    local_220._0_8_ = (long)matrix->max;
    local_1e0._8_8_ = lVar30;
    local_1e0._0_8_ = lVar30;
    local_1e0._16_8_ = lVar30;
    local_1e0._24_8_ = lVar30;
    local_340._8_8_ = lVar30;
    local_340._0_8_ = lVar30;
    local_340._16_8_ = lVar30;
    local_340._24_8_ = lVar30;
    local_2a0._8_8_ = lVar30;
    local_2a0._0_8_ = lVar30;
    local_2a0._16_8_ = lVar30;
    local_2a0._24_8_ = lVar30;
    local_260 = lVar30;
    lStack_258 = lVar30;
    lStack_250 = lVar30;
    lStack_248 = lVar30;
    ppVar19 = parasail_result_new_trace((int)uVar31,s2Len,0x20,1);
    if (ppVar19 != (parasail_result_t *)0x0) {
      local_2c0._0_8_ = uVar31;
      ppVar19->flag = ppVar19->flag | 0x4881004;
      uVar31 = (ulong)(s2Len + 6);
      local_2e0 = (ulong)(uint)open;
      ptr = (undefined1 (*) [16])parasail_memalign_int64_t(0x20,uVar31);
      ptr_00 = parasail_memalign_int64_t(0x20,uVar31);
      ptr_01 = parasail_memalign_int64_t(0x20,uVar31);
      if (ptr_01 != (int64_t *)0x0 && (ptr_00 != (int64_t *)0x0 && ptr != (undefined1 (*) [16])0x0))
      {
        uVar15 = local_2c0._0_8_;
        uVar51 = local_2c0._0_4_;
        lVar45 = (long)(int)uVar51;
        if (matrix->type == 0) {
          iVar18 = uVar51 + 3;
          ptr_02 = parasail_memalign_int64_t(0x20,(long)iVar18);
          if (ptr_02 == (int64_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar51) {
            piVar2 = matrix->mapper;
            uVar31 = 0;
            do {
              ptr_02[uVar31] = (long)piVar2[*(byte *)(local_240._0_8_ + uVar31)];
              uVar31 = uVar31 + 1;
            } while ((uVar15 & 0xffffffff) != uVar31);
          }
          iVar27 = uVar51 + 1;
          if ((int)(uVar51 + 1) < iVar18) {
            iVar27 = iVar18;
          }
          memset(ptr_02 + lVar45,0,(ulong)(~uVar51 + iVar27) * 8 + 8);
        }
        else {
          ptr_02 = (int64_t *)0x0;
        }
        uVar51 = s2Len + 3;
        local_280 = 0x7ffffffffffffffe - local_220._0_8_;
        auVar8._8_8_ = lStack_258;
        auVar8._0_8_ = local_260;
        auVar8._16_8_ = lStack_250;
        auVar8._24_8_ = lStack_248;
        local_1a0 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar8,0x3f);
        local_a0 = local_2e0;
        uStack_98 = local_2e0;
        uStack_90 = local_2e0;
        uStack_88 = local_2e0;
        local_c0._4_4_ = 0;
        local_c0._0_4_ = gap;
        local_c0._8_4_ = gap;
        local_c0._12_4_ = 0;
        local_c0._16_4_ = gap;
        local_c0._20_4_ = 0;
        local_c0._24_4_ = gap;
        local_c0._28_4_ = 0;
        uVar31 = CONCAT44(0,s2Len);
        local_e0._8_4_ = s2Len;
        local_e0._0_8_ = uVar31;
        local_e0._12_4_ = 0;
        local_e0._16_4_ = s2Len;
        local_e0._20_4_ = 0;
        local_e0._24_4_ = s2Len;
        local_e0._28_4_ = 0;
        piVar2 = matrix->mapper;
        uVar46 = 1;
        if (1 < s2Len) {
          uVar46 = (ulong)(uint)s2Len;
        }
        uVar28 = 0;
        do {
          *(long *)(ptr[1] + uVar28 * 8 + 8) = (long)piVar2[*(byte *)(local_200._0_8_ + uVar28)];
          uVar28 = uVar28 + 1;
        } while (uVar46 != uVar28);
        *ptr = (undefined1  [16])0x0;
        *(undefined8 *)ptr[1] = 0;
        uVar16 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar51) {
          uVar16 = uVar51;
        }
        uVar28 = 0;
        lStack_278 = local_280;
        lStack_270 = local_280;
        lStack_268 = local_280;
        local_1c0 = lVar45;
        lStack_1b8 = lVar45;
        lStack_1b0 = lVar45;
        lStack_1a8 = lVar45;
        memset(ptr[1] + uVar31 * 8 + 8,0,(ulong)(~s2Len + uVar16) * 8 + 8);
        do {
          ptr_00[uVar28 + 3] = 0;
          ptr_01[uVar28 + 3] = lVar30;
          uVar28 = uVar28 + 1;
        } while (uVar46 != uVar28);
        lVar45 = 0;
        do {
          ptr_00[lVar45] = lVar30;
          ptr_01[lVar45] = lVar30;
          lVar45 = lVar45 + 1;
        } while (lVar45 != 3);
        lVar45 = uVar31 + 3;
        auVar84._8_8_ = lStack_258;
        auVar84._0_8_ = local_260;
        auVar84._16_8_ = lStack_250;
        auVar84._24_8_ = lStack_248;
        do {
          ptr_00[lVar45] = lVar30;
          ptr_01[lVar45] = lVar30;
          lVar45 = lVar45 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar51);
        auVar92 = ZEXT3264(local_1e0);
        auVar93 = ZEXT3264(local_2a0);
        auVar74 = ZEXT3264(local_340);
        if (local_2c0._0_4_ < 1) {
          local_300 = auVar84;
          local_320._8_8_ = lStack_278;
          local_320._0_8_ = local_280;
          local_320._16_8_ = lStack_270;
          local_320._24_8_ = lStack_268;
        }
        else {
          uVar16 = local_2c0._0_4_ - 1;
          uVar46 = 1;
          if (1 < (int)uVar51) {
            uVar46 = (ulong)uVar51;
          }
          uVar28 = local_2c0._0_8_ & 0xffffffff;
          lVar45 = uVar31 * 4;
          local_3c0 = uVar31 - 1;
          local_3d0 = uVar31 * 3 + -3;
          local_3d8 = uVar31 * 2 + -2;
          local_360._8_8_ = 2;
          local_360._0_8_ = 3;
          local_360._16_8_ = 1;
          local_360._24_8_ = 0;
          local_3c8 = 0;
          local_100 = 1;
          uStack_f8 = 1;
          uStack_f0 = 1;
          uStack_e8 = 1;
          local_2e0 = 4;
          uStack_2d8 = 4;
          uStack_2d0 = 4;
          uStack_2c8 = 4;
          local_120 = 8;
          uStack_118 = 8;
          uStack_110 = 8;
          uStack_108 = 8;
          local_140 = 0x10;
          uStack_138 = 0x10;
          uStack_130 = 0x10;
          uStack_128 = 0x10;
          local_160 = 0x20;
          uStack_158 = 0x20;
          uStack_150 = 0x20;
          uStack_148 = 0x20;
          local_180 = 0x40;
          uStack_178 = 0x40;
          uStack_170 = 0x40;
          uStack_168 = 0x40;
          uVar43 = 0;
          local_320._8_8_ = lStack_278;
          local_320._0_8_ = local_280;
          local_320._16_8_ = lStack_270;
          local_320._24_8_ = lStack_268;
          local_300 = auVar84;
          auVar8 = auVar84;
          do {
            iVar18 = matrix->type;
            uVar29 = uVar43;
            if (iVar18 == 0) {
              uVar29 = ptr_02[uVar43];
            }
            uVar47 = uVar43 | 1;
            uVar51 = (uint)uVar43;
            if (iVar18 == 0) {
              iVar20 = ptr_02[uVar47];
            }
            else {
              uVar17 = uVar16;
              if (uVar47 < uVar28) {
                uVar17 = uVar51 | 1;
              }
              iVar20 = (int64_t)(int)uVar17;
            }
            uVar40 = uVar43 | 2;
            if (iVar18 == 0) {
              iVar37 = ptr_02[uVar40];
            }
            else {
              uVar17 = uVar16;
              if (uVar40 < uVar28) {
                uVar17 = uVar51 | 2;
              }
              iVar37 = (int64_t)(int)uVar17;
            }
            uVar52 = uVar43 | 3;
            if (iVar18 == 0) {
              iVar35 = ptr_02[uVar52];
            }
            else {
              uVar17 = uVar16;
              if (uVar52 < uVar28) {
                uVar17 = uVar51 | 3;
              }
              iVar35 = (int64_t)(int)uVar17;
            }
            piVar2 = matrix->matrix;
            lVar41 = (long)matrix->size;
            auVar5._8_8_ = lStack_1b8;
            auVar5._0_8_ = local_1c0;
            auVar5._16_8_ = lStack_1b0;
            auVar5._24_8_ = lStack_1a8;
            local_80 = vpcmpgtq_avx2(auVar5,local_360);
            uVar42 = 0;
            auVar6 = vpmovsxbq_avx2(ZEXT416(0xfffefd));
            auVar5 = local_1a0;
            auVar80 = local_1a0;
            auVar4 = auVar8;
            do {
              local_2c0 = auVar74._0_32_;
              local_220 = auVar93._0_32_;
              local_200 = auVar92._0_32_;
              auVar84 = vpermq_avx2(auVar80,0xf9);
              iVar1 = ptr_00[uVar42 + 3];
              auVar83._8_8_ = iVar1;
              auVar83._0_8_ = iVar1;
              auVar83._16_8_ = iVar1;
              auVar83._24_8_ = iVar1;
              local_240 = vpblendd_avx2(auVar84,auVar83,0xc0);
              auVar84 = vpermq_avx2(auVar4,0xf9);
              iVar1 = ptr_01[uVar42 + 3];
              auVar91._8_8_ = iVar1;
              auVar91._0_8_ = iVar1;
              auVar91._16_8_ = iVar1;
              auVar91._24_8_ = iVar1;
              auVar84 = vpblendd_avx2(auVar84,auVar91,0xc0);
              auVar4._8_8_ = uStack_98;
              auVar4._0_8_ = local_a0;
              auVar4._16_8_ = uStack_90;
              auVar4._24_8_ = uStack_88;
              auVar83 = vpsubq_avx2(local_240,auVar4);
              auVar91 = vpsubq_avx2(auVar84,local_c0);
              uVar48 = auVar91._0_8_;
              if ((long)auVar91._0_8_ < (long)auVar83._0_8_) {
                uVar48 = auVar83._0_8_;
              }
              uVar21 = vpextrq_avx(auVar83._0_16_,1);
              uVar39 = vpextrq_avx(auVar91._0_16_,1);
              if ((long)uVar39 < (long)uVar21) {
                uVar39 = uVar21;
              }
              uVar21 = auVar91._16_8_;
              if ((long)auVar91._16_8_ < (long)auVar83._16_8_) {
                uVar21 = auVar83._16_8_;
              }
              uVar22 = vpextrq_avx(auVar83._16_16_,1);
              uVar38 = vpextrq_avx(auVar91._16_16_,1);
              if ((long)uVar38 < (long)uVar22) {
                uVar38 = uVar22;
              }
              auVar7 = vpsubq_avx2(auVar80,auVar4);
              auVar8 = vpsubq_avx2(auVar8,local_c0);
              uVar22 = auVar8._0_8_;
              if ((long)auVar8._0_8_ < (long)auVar7._0_8_) {
                uVar22 = auVar7._0_8_;
              }
              uVar23 = vpextrq_avx(auVar7._0_16_,1);
              uVar49 = vpextrq_avx(auVar8._0_16_,1);
              if ((long)uVar49 < (long)uVar23) {
                uVar49 = uVar23;
              }
              auVar77._8_8_ = 0;
              auVar77._0_8_ = (long)piVar2[uVar29 * lVar41 + *(long *)(ptr[1] + uVar42 * 8 + 8)];
              auVar85._8_8_ = 0;
              auVar85._0_8_ = (long)piVar2[iVar20 * lVar41 + *(long *)(ptr[1] + uVar42 * 8)];
              auVar77 = vpunpcklqdq_avx(auVar85,auVar77);
              auVar86._8_8_ = 0;
              auVar86._0_8_ = (long)piVar2[iVar37 * lVar41 + *(long *)(*ptr + uVar42 * 8 + 8)];
              auVar94._8_8_ = 0;
              auVar94._0_8_ = (long)piVar2[iVar35 * lVar41 + *(long *)(*ptr + uVar42 * 8)];
              auVar85 = vpunpcklqdq_avx(auVar94,auVar86);
              auVar80._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar85;
              auVar80._16_16_ = ZEXT116(1) * auVar77;
              auVar84 = vpaddq_avx2(auVar80,auVar5);
              uVar23 = auVar8._16_8_;
              if ((long)auVar8._16_8_ < (long)auVar7._16_8_) {
                uVar23 = auVar7._16_8_;
              }
              uVar24 = vpextrq_avx(auVar7._16_16_,1);
              uVar36 = vpextrq_avx(auVar8._16_16_,1);
              if ((long)uVar36 < (long)uVar24) {
                uVar36 = uVar24;
              }
              uVar44 = ~((long)auVar84._0_8_ >> 0x3f) & auVar84._0_8_;
              uVar25 = vpextrq_avx(auVar84._0_16_,1);
              uVar25 = ~((long)uVar25 >> 0x3f) & uVar25;
              uVar33 = ~((long)auVar84._16_8_ >> 0x3f) & auVar84._16_8_;
              uVar32 = vpextrq_avx(auVar84._16_16_,1);
              uVar32 = ~((long)uVar32 >> 0x3f) & uVar32;
              uVar24 = uVar44;
              if ((long)uVar44 <= (long)uVar22) {
                uVar24 = uVar22;
              }
              uVar26 = uVar25;
              if ((long)uVar25 <= (long)uVar49) {
                uVar26 = uVar49;
              }
              uVar34 = uVar33;
              if ((long)uVar33 <= (long)uVar23) {
                uVar34 = uVar23;
              }
              uVar50 = uVar32;
              if ((long)uVar32 <= (long)uVar36) {
                uVar50 = uVar36;
              }
              if ((long)uVar24 <= (long)uVar48) {
                uVar24 = uVar48;
              }
              if ((long)uVar26 <= (long)uVar39) {
                uVar26 = uVar39;
              }
              if ((long)uVar34 <= (long)uVar21) {
                uVar34 = uVar21;
              }
              if ((long)uVar50 <= (long)uVar38) {
                uVar50 = uVar38;
              }
              auVar73._8_8_ = 0;
              auVar73._0_8_ = uVar21;
              auVar81._8_8_ = 0;
              auVar81._0_8_ = uVar38;
              auVar77 = vpunpcklqdq_avx(auVar73,auVar81);
              auVar79._8_8_ = 0;
              auVar79._0_8_ = uVar39;
              auVar78._8_8_ = 0;
              auVar78._0_8_ = uVar48;
              auVar85 = vpunpcklqdq_avx(auVar78,auVar79);
              auVar56._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar85;
              auVar56._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar77
              ;
              auVar75._8_8_ = 0;
              auVar75._0_8_ = uVar32;
              auVar96._8_8_ = 0;
              auVar96._0_8_ = uVar33;
              auVar77 = vpunpcklqdq_avx(auVar96,auVar75);
              auVar87._8_8_ = 0;
              auVar87._0_8_ = uVar44;
              auVar95._8_8_ = 0;
              auVar95._0_8_ = uVar25;
              auVar85 = vpunpcklqdq_avx(auVar87,auVar95);
              auVar79 = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar85;
              auVar94 = ZEXT116(1) * auVar77;
              auVar66._8_8_ = 0;
              auVar66._0_8_ = uVar34;
              auVar72._8_8_ = 0;
              auVar72._0_8_ = uVar50;
              auVar85 = vpunpcklqdq_avx(auVar66,auVar72);
              auVar58._8_8_ = 0;
              auVar58._0_8_ = uVar26;
              auVar82._8_8_ = 0;
              auVar82._0_8_ = uVar24;
              auVar86 = vpunpcklqdq_avx(auVar82,auVar58);
              auVar97._0_16_ = ZEXT116(0) * auVar85 + ZEXT116(1) * auVar86;
              auVar97._16_16_ = ZEXT116(1) * auVar85;
              auVar76._0_8_ = -(ulong)(auVar6._0_8_ == -1);
              auVar76._8_8_ = -(ulong)(auVar6._8_8_ == -1);
              auVar76._16_8_ = -(ulong)(auVar6._16_8_ == -1);
              auVar76._24_8_ = -(ulong)(auVar6._24_8_ == -1);
              auVar80 = vpandn_avx2(auVar76,auVar97);
              auVar4 = vblendvpd_avx(auVar56,auVar84,auVar76);
              auVar5 = vpcmpeqd_avx2(ZEXT1632(auVar77),ZEXT1632(auVar77));
              uVar48 = auVar80._0_8_;
              uVar39 = auVar80._16_8_;
              if (3 < uVar42) {
                uVar21 = local_320._0_8_;
                if ((long)uVar48 <= (long)local_320._0_8_) {
                  uVar21 = uVar48;
                }
                uVar24 = vpextrq_avx(local_320._0_16_,1);
                uVar38 = vpextrq_avx(auVar80._0_16_,1);
                if ((long)uVar38 <= (long)uVar24) {
                  uVar24 = uVar38;
                }
                uVar25 = local_320._16_8_;
                if ((long)uVar39 <= (long)local_320._16_8_) {
                  uVar25 = uVar39;
                }
                uVar33 = vpextrq_avx(local_320._16_16_,1);
                uVar32 = vpextrq_avx(auVar80._16_16_,1);
                if ((long)uVar32 <= (long)uVar33) {
                  uVar33 = uVar32;
                }
                auVar53._8_8_ = 0;
                auVar53._0_8_ = uVar33;
                auVar59._8_8_ = 0;
                auVar59._0_8_ = uVar25;
                auVar77 = vpunpcklqdq_avx(auVar59,auVar53);
                uVar25 = uVar48;
                if ((long)uVar48 < (long)local_300._0_8_) {
                  uVar25 = local_300._0_8_;
                }
                uVar33 = vpextrq_avx(local_300._0_16_,1);
                if ((long)uVar38 < (long)uVar33) {
                  uVar38 = uVar33;
                }
                uVar33 = uVar39;
                if ((long)uVar39 < (long)local_300._16_8_) {
                  uVar33 = local_300._16_8_;
                }
                uVar44 = vpextrq_avx(local_300._16_16_,1);
                auVar60._8_8_ = 0;
                auVar60._0_8_ = uVar24;
                auVar67._8_8_ = 0;
                auVar67._0_8_ = uVar21;
                auVar85 = vpunpcklqdq_avx(auVar67,auVar60);
                if ((long)uVar32 < (long)uVar44) {
                  uVar32 = uVar44;
                }
                local_320._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar85;
                local_320._16_16_ = ZEXT116(1) * auVar77;
                auVar54._8_8_ = 0;
                auVar54._0_8_ = uVar32;
                auVar61._8_8_ = 0;
                auVar61._0_8_ = uVar33;
                auVar77 = vpunpcklqdq_avx(auVar61,auVar54);
                auVar62._8_8_ = 0;
                auVar62._0_8_ = uVar38;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = uVar25;
                auVar85 = vpunpcklqdq_avx(auVar68,auVar62);
                local_300._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar85;
                local_300._16_16_ = ZEXT116(1) * auVar77;
              }
              auVar57._0_8_ = -(ulong)(uVar48 == auVar79._0_8_);
              lVar88 = auVar80._8_8_;
              auVar57._8_8_ = -(ulong)(lVar88 == auVar79._8_8_);
              auVar57._16_8_ = -(ulong)(uVar39 == auVar94._0_8_);
              lVar89 = auVar80._24_8_;
              auVar57._24_8_ = -(ulong)(lVar89 == auVar94._8_8_);
              auVar65._0_8_ = -(ulong)(uVar48 == auVar4._0_8_);
              auVar65._8_8_ = -(ulong)(lVar88 == auVar4._8_8_);
              auVar65._16_8_ = -(ulong)(uVar39 == auVar4._16_8_);
              auVar65._24_8_ = -(ulong)(lVar89 == auVar4._24_8_);
              auVar14._8_8_ = 1;
              auVar14._0_8_ = 1;
              auVar14._16_8_ = 1;
              auVar14._24_8_ = 1;
              auVar9 = vpsubq_avx2(auVar14,auVar65);
              auVar70._0_8_ = -(ulong)(uVar48 == 0);
              auVar70._8_8_ = -(ulong)(lVar88 == 0);
              auVar70._16_8_ = -(ulong)(uVar39 == 0);
              auVar70._24_8_ = -(ulong)(lVar89 == 0);
              auVar10._8_8_ = 4;
              auVar10._0_8_ = 4;
              auVar10._16_8_ = 4;
              auVar10._24_8_ = 4;
              auVar56 = vpandn_avx2(auVar70,auVar10);
              auVar56 = vblendvpd_avx(auVar9,auVar56,auVar57);
              auVar8 = vpcmpgtq_avx2(auVar7,auVar8);
              auVar12._8_8_ = 0x10;
              auVar12._0_8_ = 0x10;
              auVar12._16_8_ = 0x10;
              auVar12._24_8_ = 0x10;
              auVar13._8_8_ = 8;
              auVar13._0_8_ = 8;
              auVar13._16_8_ = 8;
              auVar13._24_8_ = 8;
              auVar8 = vblendvpd_avx(auVar12,auVar13,auVar8);
              auVar83 = vpcmpgtq_avx2(auVar83,auVar91);
              auVar9._8_8_ = 0x40;
              auVar9._0_8_ = 0x40;
              auVar9._16_8_ = 0x40;
              auVar9._24_8_ = 0x40;
              auVar11._8_8_ = 0x20;
              auVar11._0_8_ = 0x20;
              auVar11._16_8_ = 0x20;
              auVar11._24_8_ = 0x20;
              auVar83 = vblendvpd_avx(auVar9,auVar11,auVar83);
              auVar8 = vorpd_avx(auVar83,auVar8);
              auVar8 = vorpd_avx(auVar8,auVar56);
              piVar3 = ((ppVar19->field_4).rowcols)->score_row;
              if (uVar42 < uVar31) {
                *(char *)((long)piVar3 + uVar42 + local_3c8) = auVar8[0x10];
              }
              if (uVar42 - 1 < uVar31 && uVar47 < uVar28) {
                *(char *)((long)piVar3 + uVar42 + local_3c0) = auVar8[0x10];
              }
              if ((uVar40 < uVar28) && ((long)(uVar42 - 2) < (long)uVar31 && 1 < uVar42)) {
                *(char *)((long)piVar3 + uVar42 + local_3d8) = auVar8[0];
              }
              auVar55._8_8_ = 0;
              auVar55._0_8_ = uVar49;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = uVar22;
              auVar77 = vpunpcklqdq_avx(auVar63,auVar55);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = uVar36;
              auVar69._8_8_ = 0;
              auVar69._0_8_ = uVar23;
              auVar85 = vpunpcklqdq_avx(auVar69,auVar64);
              auVar90._0_16_ = ZEXT116(0) * auVar85 + ZEXT116(1) * auVar77;
              auVar90._16_16_ = ZEXT116(1) * auVar85;
              if ((uVar52 < uVar28) && ((long)(uVar42 - 3) < (long)uVar31 && 2 < uVar42)) {
                *(char *)((long)piVar3 + uVar42 + local_3d0) = auVar8[0];
              }
              auVar5 = vpcmpgtq_avx2(auVar6,auVar5);
              auVar8 = vpcmpgtq_avx2(local_e0,auVar6);
              auVar8 = vpand_avx2(auVar8,local_80);
              auVar5 = vpand_avx2(auVar8,auVar5);
              auVar77 = vpackssdw_avx(auVar5._0_16_,auVar5._16_16_);
              auVar71._0_8_ = -(ulong)(uVar48 == auVar92._0_8_);
              auVar71._8_8_ = -(ulong)(lVar88 == auVar92._8_8_);
              auVar71._16_8_ = -(ulong)(uVar39 == auVar92._16_8_);
              auVar71._24_8_ = -(ulong)(lVar89 == auVar92._24_8_);
              auVar56 = vpcmpgtq_avx2(auVar80,local_200);
              auVar91 = vpcmpeqd_avx2(auVar7,auVar7);
              auVar8 = vpand_avx2(auVar56,auVar5);
              local_1e0 = vblendvpd_avx(local_200,auVar97,auVar8);
              auVar92 = ZEXT3264(local_1e0);
              auVar85 = vpackssdw_avx(auVar8._0_16_,auVar8._16_16_);
              auVar8 = vpcmpgtq_avx2(local_220,auVar6);
              auVar83 = vpand_avx2(auVar71,auVar8);
              auVar86 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
              auVar77 = vblendvps_avx(auVar85,auVar77,auVar86);
              auVar8 = vblendvpd_avx(auVar90,auVar84,auVar76);
              auVar7 = vpmovsxdq_avx2(auVar77);
              local_340 = vblendvpd_avx(auVar74._0_32_,local_360,auVar7);
              auVar74 = ZEXT3264(local_340);
              auVar83 = vpor_avx2(auVar83,auVar56);
              auVar5 = vpand_avx2(auVar5,auVar83);
              local_2a0 = vblendvpd_avx(local_220,auVar6,auVar5);
              auVar93 = ZEXT3264(local_2a0);
              ptr_00[uVar42] = uVar48;
              ptr_01[uVar42] = auVar4._0_8_;
              auVar6 = vpsubq_avx2(auVar6,auVar91);
              uVar42 = uVar42 + 1;
              auVar5 = local_240;
            } while (uVar46 != uVar42);
            auVar6._8_8_ = 4;
            auVar6._0_8_ = 4;
            auVar6._16_8_ = 4;
            auVar6._24_8_ = 4;
            local_360 = vpaddq_avx2(local_360,auVar6);
            uVar43 = uVar43 + 4;
            local_3c8 = local_3c8 + lVar45;
            local_3c0 = local_3c0 + lVar45;
            local_3d0 = local_3d0 + lVar45;
            local_3d8 = local_3d8 + lVar45;
            auVar8 = auVar84;
          } while (uVar43 < uVar28);
        }
        lVar45 = 0;
        iVar18 = 0;
        iVar27 = 0;
        do {
          lVar41 = *(long *)(local_1e0 + lVar45 * 8);
          if (lVar30 < lVar41) {
            iVar18 = *(int *)(local_340 + lVar45 * 8);
            lVar30 = lVar41;
            iVar27 = *(int *)(local_2a0 + lVar45 * 8);
          }
          else if (lVar41 == lVar30) {
            lVar41 = *(long *)(local_2a0 + lVar45 * 8);
            if (lVar41 < iVar27) {
              iVar18 = *(int *)(local_340 + lVar45 * 8);
              iVar27 = (int)lVar41;
            }
            else if ((lVar41 == iVar27) && (*(long *)(local_340 + lVar45 * 8) < (long)iVar18)) {
              iVar18 = (int)*(long *)(local_340 + lVar45 * 8);
              iVar27 = (int)lVar41;
            }
          }
          lVar45 = lVar45 + 1;
        } while ((int)lVar45 != 4);
        auVar8 = vpcmpgtq_avx2(auVar84,local_320);
        auVar7._8_8_ = lStack_278;
        auVar7._0_8_ = local_280;
        auVar7._16_8_ = lStack_270;
        auVar7._24_8_ = lStack_268;
        auVar84 = vpcmpgtq_avx2(local_300,auVar7);
        auVar8 = vpor_avx2(auVar8,auVar84);
        if ((((auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             SUB321(auVar8 >> 0x7f,0) != '\0') || SUB321(auVar8 >> 0xbf,0) != '\0') ||
            auVar8[0x1f] < '\0') {
          *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
          lVar30 = 0;
          iVar27 = 0;
          iVar18 = 0;
        }
        ppVar19->score = (int)lVar30;
        ppVar19->end_query = iVar18;
        ppVar19->end_ref = iVar27;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar19;
        }
        return ppVar19;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;
    __m256i vTDiag;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTZero;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }
        
    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);
    vTDiag = _mm256_set1_epi64x_rpl(PARASAIL_DIAG);
    vTIns = _mm256_set1_epi64x_rpl(PARASAIL_INS);
    vTDel = _mm256_set1_epi64x_rpl(PARASAIL_DEL);
    vTZero = _mm256_set1_epi64x_rpl(PARASAIL_ZERO);
    vTDiagE = _mm256_set1_epi64x_rpl(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi64x_rpl(PARASAIL_INS_E);
    vTDiagF = _mm256_set1_epi64x_rpl(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi64x_rpl(PARASAIL_DEL_F);

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 32, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vF = vNegInf;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vNWH = _mm256_max_epi64_rpl(vNWH, vZero);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
            /* trace table */
            {
                __m256i cond_zero = _mm256_cmpeq_epi64(vWH, vZero);
                __m256i case1 = _mm256_cmpeq_epi64(vWH, vNWH);
                __m256i case2 = _mm256_cmpeq_epi64(vWH, vF);
                __m256i vT = _mm256_blendv_epi8(
                        _mm256_blendv_epi8(vTIns, vTDel, case2),
                        _mm256_blendv_epi8(vTDiag, vTZero, cond_zero),
                        case1);
                __m256i condE = _mm256_cmpgt_epi64(vE_opn, vE_ext);
                __m256i condF = _mm256_cmpgt_epi64(vF_opn, vF_ext);
                __m256i vET = _mm256_blendv_epi8(vTInsE, vTDiagE, condE);
                __m256i vFT = _mm256_blendv_epi8(vTDelF, vTDiagF, condF);
                vT = _mm256_or_si256(vT, vET);
                vT = _mm256_or_si256(vT, vFT);
                arr_store_si256(result->trace->trace_table, vT, i, s1Len, j, s2Len);
            }
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}